

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
xcardMT::LinearSearch_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,xcardMT *this)

{
  bool bVar1;
  long lVar2;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  const_iterator __position;
  unsigned_long uVar4;
  int iVar5;
  char *pcVar6;
  iterator __last;
  pointer pbVar7;
  pointer pbVar8;
  undefined8 uStack_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_228;
  pointer local_210;
  pointer local_1f8;
  pointer local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  bool local_1c9;
  pointer local_1c8;
  pointer local_1c0;
  pointer local_1b8;
  ulong local_1b0;
  pointer local_1a8;
  pointer local_1a0;
  pointer local_198;
  pointer local_190;
  ulong local_188;
  pointer local_180;
  longlong local_178;
  longlong local_170;
  string *local_168;
  string *local_160;
  string *local_158;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_148;
  xcardMT *local_140;
  longlong local_138;
  int local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_110;
  const_iterator local_108;
  int local_fc;
  pointer pbStack_f8;
  int i_2;
  long local_f0;
  xcardMT *local_e8;
  code *local_e0;
  undefined8 local_d8;
  thread local_d0;
  int local_c4;
  ulong uStack_c0;
  int i_1;
  unsigned_long __vla_expr1;
  long local_b0;
  long per_thread;
  long remaining;
  ulong local_98;
  unsigned_long __vla_expr0;
  longlong local_88;
  longlong card_b;
  longlong max_s;
  string local_70 [4];
  int i;
  string max_search;
  int zreq;
  int initial_length;
  string local_38 [8];
  string cardbuf;
  xcardMT *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *final_result;
  
  uStack_230 = 0x1104a8;
  local_150 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              __return_storage_ptr__;
  local_148 = __return_storage_ptr__;
  local_140 = this;
  std::__cxx11::string::string(local_38);
  uStack_230 = 0x1104bd;
  local_138 = std::__cxx11::stoll((string *)local_140,(size_t *)0x0,10);
  if (-1 < local_138) {
    uStack_230 = 0x1104e7;
    std::__cxx11::string::insert((ulong)local_38,(string *)0x0);
  }
  local_158 = local_38;
  uStack_230 = 0x11050c;
  iVar5 = std::__cxx11::string::length();
  uStack_230 = 0x11052c;
  std::__cxx11::string::string(local_70,local_158);
  for (max_s._4_4_ = 0; max_s._4_4_ < 0x10 - iVar5; max_s._4_4_ = max_s._4_4_ + 1) {
    local_160 = local_70;
    uStack_230 = 0x11054d;
    pcVar6 = (char *)std::__cxx11::string::length();
    uStack_230 = 0x110563;
    std::__cxx11::string::insert((ulong)local_160,pcVar6);
    local_168 = local_38;
    uStack_230 = 0x110575;
    pcVar6 = (char *)std::__cxx11::string::length();
    uStack_230 = 0x11058b;
    std::__cxx11::string::insert((ulong)local_168,pcVar6);
  }
  uStack_230 = 0x1105bd;
  local_170 = std::__cxx11::stoll((string *)local_70,(size_t *)0x0,10);
  uStack_230 = 0x1105e3;
  card_b = local_170;
  local_178 = std::__cxx11::stoll((string *)local_38,(size_t *)0x0,10);
  local_88 = local_178;
  if (local_140->max_threads < 1) {
    uStack_230 = 0x110609;
    iVar5 = std::thread::hardware_concurrency();
    local_140->max_threads = iVar5;
  }
  local_188 = (ulong)(uint)local_140->max_threads;
  lVar2 = -(local_188 * 0x18 + 0xf & 0xfffffffffffffff0);
  pbVar7 = (pointer)((long)&vStack_228 + lVar2);
  local_180 = pbVar7;
  local_98 = local_188;
  __vla_expr0 = (unsigned_long)&vStack_228;
  if (local_188 != 0) {
    local_198 = pbVar7 + local_188 * 0x18;
    local_190 = pbVar7;
    __vla_expr0 = (unsigned_long)&vStack_228;
    do {
      pbVar8 = local_190;
      local_1a0 = local_190;
      *(undefined8 *)((long)&uStack_230 + lVar2) = 0x110696;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)pbVar8);
      local_190 = local_1a0 + 0x18;
    } while (local_190 != local_198);
  }
  pvVar3 = local_150;
  remaining._7_1_ = 0;
  *(undefined8 *)((long)&uStack_230 + lVar2) = 0x1106c7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)pvVar3);
  per_thread = card_b - local_88;
  __vla_expr1 = (unsigned_long)pbVar7;
  do {
    local_b0 = per_thread / (long)local_140->max_threads;
    if (local_b0 <= local_140->max_threads) {
      local_b0 = per_thread;
      local_140->max_threads = 1;
    }
    local_1b0 = (ulong)(uint)local_140->max_threads;
    pbVar7 = (pointer)(__vla_expr1 + -(local_1b0 * 8 + 0xf & 0xfffffffffffffff0));
    local_1a8 = pbVar7;
    uStack_c0 = local_1b0;
    if (local_1b0 != 0) {
      local_1c0 = pbVar7 + local_1b0 * 8;
      local_1b8 = pbVar7;
      do {
        pbVar8 = local_1b8;
        local_1c8 = local_1b8;
        ((id *)&pbVar7[-8].field_0x0)->_M_thread = 0x11079f;
        std::thread::thread((thread *)pbVar8);
        local_1b8 = local_1c8 + 8;
      } while (local_1b8 != local_1c0);
    }
    for (local_c4 = 0; bVar1 = local_c4 < local_140->max_threads,
        local_1c9 = bVar1 && local_88 < card_b, bVar1 && local_88 < card_b; local_c4 = local_c4 + 1)
    {
      local_88 = local_88 + local_b0;
      local_e0 = runnerLS;
      local_d8 = 0;
      local_e8 = local_140;
      local_f0 = local_88 - local_b0;
      pbStack_f8 = local_180 + (long)local_c4 * 0x18;
      ((id *)&pbVar7[-8].field_0x0)->_M_thread = 0x110898;
      std::thread::
      thread<void(xcardMT::*)(long_long,long_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*),xcardMT*,long_long,long_long&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,void>
                (&local_d0,(type *)&local_e0,&local_e8,&local_f0,&local_88,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  **)&stack0xffffffffffffff08);
      pbVar8 = local_1a8 + (long)local_c4 * 8;
      ((id *)&pbVar7[-8].field_0x0)->_M_thread = 0x1108bb;
      std::thread::operator=((thread *)pbVar8,&local_d0);
      ((id *)&pbVar7[-8].field_0x0)->_M_thread = 0x1108c7;
      std::thread::~thread(&local_d0);
    }
    for (local_fc = 0; local_fc < local_140->max_threads; local_fc = local_fc + 1) {
      ((id *)&pbVar7[-8].field_0x0)->_M_thread = 0x11095a;
      std::thread::join();
      pvVar3 = local_150;
      ((id *)&pbVar7[-8].field_0x0)->_M_thread = 0x110968;
      local_110._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)pvVar3);
      ((id *)&pbVar7[-8].field_0x0)->_M_thread = 0x110982;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_108,&local_110);
      pbVar8 = local_180 + (long)local_fc * 0x18;
      ((id *)&pbVar7[-8].field_0x0)->_M_thread = 0x11099d;
      local_118._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)pbVar8);
      pbVar8 = local_180 + (long)local_fc * 0x18;
      ((id *)&pbVar7[-8].field_0x0)->_M_thread = 0x1109c2;
      __last = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)pbVar8);
      __position._M_current = local_108._M_current;
      __first._M_current = local_118._M_current;
      pvVar3 = local_150;
      local_120 = __last._M_current;
      ((id *)&pbVar7[-8].field_0x0)->_M_thread = 0x1109ea;
      local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                            (pvVar3,__position,__first,__last._M_current);
      local_128 = local_1e8;
    }
    per_thread = per_thread - local_b0 * local_140->max_threads;
    if (per_thread == 0) {
      local_12c = 6;
    }
    else {
      local_12c = 0;
    }
    local_1f0 = local_1a8 + local_1b0 * 8;
    if (local_1a8 != local_1f0) {
      do {
        pbVar8 = local_1f0 + -8;
        local_1f8 = pbVar8;
        ((id *)&pbVar7[-8].field_0x0)->_M_thread = 0x110a97;
        std::thread::~thread((thread *)pbVar8);
        local_1f0 = local_1f8;
      } while (local_1f8 != local_1a8);
    }
    uVar4 = __vla_expr1;
  } while (local_12c == 0);
  remaining._7_1_ = 1;
  local_12c = 1;
  local_210 = local_180 + local_188 * 0x18;
  if (local_180 != local_210) {
    do {
      pbVar7 = local_210 + -0x18;
      vStack_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar7;
      *(undefined8 *)(uVar4 - 8) = 0x110b99;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pbVar7);
      local_210 = vStack_228.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    } while (vStack_228.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage != local_180);
  }
  uVar4 = __vla_expr0;
  *(undefined8 *)(__vla_expr0 - 8) = 0x110bc6;
  std::__cxx11::string::~string(local_70);
  *(undefined8 *)(uVar4 - 8) = 0x110bcf;
  std::__cxx11::string::~string(local_38);
  return local_148;
}

Assistant:

std::vector<std::string> xcardMT::LinearSearch()
{

    std::string cardbuf;

    if (std::stoll(this->prefix) > -1)
    {
        cardbuf.insert(0, this->prefix);
    }

    int initial_length = cardbuf.length();
    int zreq = 16 - initial_length;

    std::string max_search = cardbuf;

    for (int i = 0; i < zreq; i++)
    {
        max_search.insert(max_search.length(), "9");
        cardbuf.insert(cardbuf.length(), "0");
    }

    //convert to long long int
    long long int max_s = std::stoll(max_search);
    long long int card_b = std::stoll(cardbuf);

    //init. threads and results vector.
    if (this->max_threads <= 0){
        this->max_threads = std::thread::hardware_concurrency();
    }

    std::vector<std::string> results[this->max_threads];
    std::vector<std::string> final_result;

    long int remaining = max_s - card_b;

    while (true){
        long int per_thread = remaining / this->max_threads;

        if (per_thread <= this->max_threads){
            per_thread = remaining;
            this->max_threads = 1;
        }

        std::thread threads[this->max_threads];

        //dispatch
        for (int i = 0; i < this->max_threads && card_b < max_s; i++)
        {
            card_b += per_thread;
            threads[i] = std::thread(&xcardMT::runnerLS, this, card_b-per_thread, card_b, &results[i]);
        }
        

        //join
        for (int i = 0; i < this->max_threads; i++)
        {
            threads[i].join();
            final_result.insert(final_result.end(), results[i].begin(), results[i].end());
        }
        
        remaining -= per_thread * this->max_threads;
        if (remaining == 0){
            break;
        }

    }

    return final_result;
}